

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls_preset_coding_parameters.h
# Opt level: O0

bool charls::is_valid(jpegls_pc_parameters *pc_parameters,int32_t maximum_component_value,
                     int32_t near_lossless,jpegls_pc_parameters *validated_parameters)

{
  int iVar1;
  bool bVar2;
  unsigned_short uVar3;
  int *piVar4;
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c;
  int32_t local_78;
  int local_60;
  int local_5c;
  int local_58;
  int local_4c;
  int local_48;
  int local_44;
  int32_t threshold2;
  int32_t threshold1;
  jpegls_pc_parameters default_parameters;
  int32_t maximum_sample_value;
  jpegls_pc_parameters *validated_parameters_local;
  int32_t near_lossless_local;
  int32_t maximum_component_value_local;
  jpegls_pc_parameters *pc_parameters_local;
  
  bVar2 = false;
  unique0x1000023b = validated_parameters;
  if (2 < maximum_component_value) {
    uVar3 = std::numeric_limits<unsigned_short>::max();
    bVar2 = maximum_component_value <= (int)(uint)uVar3;
  }
  if (bVar2) {
    if ((pc_parameters->maximum_sample_value == 0) ||
       ((0 < pc_parameters->maximum_sample_value &&
        (pc_parameters->maximum_sample_value <= maximum_component_value)))) {
      local_58 = maximum_component_value;
      if (pc_parameters->maximum_sample_value != 0) {
        local_58 = pc_parameters->maximum_sample_value;
      }
      default_parameters.threshold3 = local_58;
      if ((pc_parameters->threshold1 == 0) ||
         ((near_lossless + 1 <= pc_parameters->threshold1 && (pc_parameters->threshold1 <= local_58)
          ))) {
        compute_default((jpegls_pc_parameters *)&threshold2,local_58,near_lossless);
        if (pc_parameters->threshold1 == 0) {
          local_5c = threshold1;
        }
        else {
          local_5c = pc_parameters->threshold1;
        }
        local_44 = local_5c;
        if ((pc_parameters->threshold2 == 0) ||
           ((local_5c <= pc_parameters->threshold2 &&
            (pc_parameters->threshold2 <= default_parameters.threshold3)))) {
          if (pc_parameters->threshold2 == 0) {
            local_60 = default_parameters.maximum_sample_value;
          }
          else {
            local_60 = pc_parameters->threshold2;
          }
          local_48 = local_60;
          if ((pc_parameters->threshold3 == 0) ||
             ((local_60 <= pc_parameters->threshold3 &&
              (pc_parameters->threshold3 <= default_parameters.threshold3)))) {
            bVar2 = false;
            if ((pc_parameters->reset_value != 0) && (bVar2 = true, 2 < pc_parameters->reset_value))
            {
              iVar1 = pc_parameters->reset_value;
              local_4c = 0xff;
              piVar4 = std::max<int>(&local_4c,&default_parameters.threshold3);
              bVar2 = *piVar4 < iVar1;
            }
            if (bVar2) {
              pc_parameters_local._7_1_ = false;
            }
            else {
              if (stack0xffffffffffffffd8 != (jpegls_pc_parameters *)0x0) {
                stack0xffffffffffffffd8->maximum_sample_value = default_parameters.threshold3;
                if (pc_parameters->threshold1 == 0) {
                  local_78 = threshold1;
                }
                else {
                  local_78 = pc_parameters->threshold1;
                }
                stack0xffffffffffffffd8->threshold1 = local_78;
                if (pc_parameters->threshold2 == 0) {
                  local_7c = default_parameters.maximum_sample_value;
                }
                else {
                  local_7c = pc_parameters->threshold2;
                }
                stack0xffffffffffffffd8->threshold2 = local_7c;
                if (pc_parameters->threshold3 == 0) {
                  local_80 = default_parameters.threshold1;
                }
                else {
                  local_80 = pc_parameters->threshold3;
                }
                stack0xffffffffffffffd8->threshold3 = local_80;
                if (pc_parameters->reset_value == 0) {
                  local_84 = default_parameters.threshold2;
                }
                else {
                  local_84 = pc_parameters->reset_value;
                }
                stack0xffffffffffffffd8->reset_value = local_84;
              }
              pc_parameters_local._7_1_ = true;
            }
          }
          else {
            pc_parameters_local._7_1_ = false;
          }
        }
        else {
          pc_parameters_local._7_1_ = false;
        }
      }
      else {
        pc_parameters_local._7_1_ = false;
      }
    }
    else {
      pc_parameters_local._7_1_ = false;
    }
    return pc_parameters_local._7_1_;
  }
  __assert_fail("maximum_component_value >= 3 && maximum_component_value <= std::numeric_limits<uint16_t>::max()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                ,0x51,
                "bool charls::is_valid(const jpegls_pc_parameters &, const int32_t, const int32_t, jpegls_pc_parameters *)"
               );
}

Assistant:

inline bool is_valid(const jpegls_pc_parameters& pc_parameters, const int32_t maximum_component_value,
                     const int32_t near_lossless, jpegls_pc_parameters* validated_parameters = nullptr) noexcept
{
    ASSERT(maximum_component_value >= 3 && maximum_component_value <= std::numeric_limits<uint16_t>::max());

    // ISO/IEC 14495-1, C.2.4.1.1, Table C.1 defines the valid JPEG-LS preset coding parameters values.
    if (pc_parameters.maximum_sample_value != 0 &&
        (pc_parameters.maximum_sample_value < 1 || pc_parameters.maximum_sample_value > maximum_component_value))
        return false;

    const int32_t maximum_sample_value{pc_parameters.maximum_sample_value != 0 ? pc_parameters.maximum_sample_value
                                                                               : maximum_component_value};
    if (pc_parameters.threshold1 != 0 &&
        (pc_parameters.threshold1 < near_lossless + 1 || pc_parameters.threshold1 > maximum_sample_value))
        return false;

    const jpegls_pc_parameters default_parameters{compute_default(maximum_sample_value, near_lossless)};
    const int32_t threshold1{pc_parameters.threshold1 != 0 ? pc_parameters.threshold1 : default_parameters.threshold1};
    if (pc_parameters.threshold2 != 0 &&
        (pc_parameters.threshold2 < threshold1 || pc_parameters.threshold2 > maximum_sample_value))
        return false;

    const int32_t threshold2{pc_parameters.threshold2 != 0 ? pc_parameters.threshold2 : default_parameters.threshold2};
    if (pc_parameters.threshold3 != 0 &&
        (pc_parameters.threshold3 < threshold2 || pc_parameters.threshold3 > maximum_sample_value))
        return false;

    if (pc_parameters.reset_value != 0 &&
        (pc_parameters.reset_value < 3 || pc_parameters.reset_value > std::max(255, maximum_sample_value)))
        return false;

    if (validated_parameters)
    {
        validated_parameters->maximum_sample_value = maximum_sample_value;
        validated_parameters->threshold1 =
            pc_parameters.threshold1 != 0 ? pc_parameters.threshold1 : default_parameters.threshold1;
        validated_parameters->threshold2 =
            pc_parameters.threshold2 != 0 ? pc_parameters.threshold2 : default_parameters.threshold2;
        validated_parameters->threshold3 =
            pc_parameters.threshold3 != 0 ? pc_parameters.threshold3 : default_parameters.threshold3;
        validated_parameters->reset_value =
            pc_parameters.reset_value != 0 ? pc_parameters.reset_value : default_parameters.reset_value;
    }

    return true;
}